

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O0

cf_hashtbl_iter_t cf_hashtbl_iter_next(cf_hashtbl_iter_t it)

{
  cf_hashtbl_t *pcVar1;
  uint local_24;
  cf_uint32_t i;
  cf_hashtbl_t *self;
  cf_hashtbl_iter_t it_local;
  
  pcVar1 = it->tbl;
  local_24 = it->hash;
  if (it->next == (hashtbl_node *)0x0) {
    do {
      local_24 = local_24 + 1;
      if (pcVar1->hashmsk < local_24) {
        return (cf_hashtbl_iter_t)0x0;
      }
    } while (pcVar1->table[local_24] == (hashtbl_node_t *)0x0);
    it_local = pcVar1->table[local_24];
  }
  else {
    it_local = it->next;
  }
  return it_local;
}

Assistant:

cf_hashtbl_iter_t cf_hashtbl_iter_next(cf_hashtbl_iter_t it) {
    cf_hashtbl_t* self = it->tbl;

    /* the next index */
    cf_uint32_t i = it->hash + 1;
    if (it->next) {
        return it->next;
    }
    while (i <= self->hashmsk) {
        if (self->table[i]) {
            return self->table[i];
        }
        i++;
    }
    return CF_NULL_PTR;
}